

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<QString,_QString>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QString,_QString>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QString,_QString>_> *old)

{
  Data *pDVar1;
  pair<QString,_QString> *ppVar2;
  undefined1 *puVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  pair<QString,_QString> *b;
  pair<QString,_QString> *e;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QString,_QString>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<std::pair<QString,_QString>_> *)0x0 && where == GrowsAtEnd) {
    pDVar1 = this->d;
    if (pDVar1 == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pDVar1 == (Data *)0x0) {
        lVar5 = 0;
        lVar6 = 0;
      }
      else {
        lVar5 = (pDVar1->super_QArrayData).alloc;
        lVar6 = (this->size - (pDVar1->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 4) * -0x5555555555555555;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QtPrivate::QMovableArrayOps<std::pair<QString,_QString>_>::reallocate
                  ((QMovableArrayOps<std::pair<QString,_QString>_> *)this,lVar5 + n + lVar6,Grow);
        return;
      }
      goto LAB_0026a74f;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  ppVar2 = local_48.ptr;
  if ((n < 1) || (local_48.ptr != (pair<QString,_QString> *)0x0)) {
    if (this->size != 0) {
      lVar5 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar4 = true;
      }
      else {
        bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      b = this->ptr;
      e = b + lVar5;
      if ((old != (QArrayDataPointer<std::pair<QString,_QString>_> *)0x0) || (bVar4)) {
        if ((lVar5 != 0) && (0 < lVar5)) {
          do {
            std::pair<QString,_QString>::pair(ppVar2 + local_48.size,b);
            b = b + 1;
            local_48.size = local_48.size + 1;
          } while (b < e);
        }
      }
      else {
        QtPrivate::QGenericArrayOps<std::pair<QString,_QString>_>::moveAppend
                  ((QGenericArrayOps<std::pair<QString,_QString>_> *)&local_48,b,e);
      }
    }
    pDVar1 = this->d;
    ppVar2 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    puVar3 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = pDVar1;
    local_48.ptr = ppVar2;
    local_48.size = (qsizetype)puVar3;
    if (old != (QArrayDataPointer<std::pair<QString,_QString>_> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar1;
      old->ptr = ppVar2;
      local_48.size = old->size;
      old->size = (qsizetype)puVar3;
    }
    ~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    qBadAlloc();
  }
LAB_0026a74f:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }